

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsEffectSource::draw(QGraphicsEffectSource *this,QPainter *painter)

{
  long lVar1;
  long lVar2;
  char cVar3;
  undefined1 *puVar4;
  long lVar5;
  qreal *pqVar6;
  undefined8 *puVar7;
  QTransform *pQVar8;
  undefined8 *puVar9;
  long in_FS_OFFSET;
  byte bVar10;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined8 local_c8 [9];
  undefined2 local_80;
  QTransform restoreTransform;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_e8);
  cVar3 = QPixmapCache::find((Key *)(lVar2 + 0x88),(QPixmap *)&local_e8);
  if (cVar3 == '\0') {
    (**(code **)(**(long **)(this + 8) + 0x50))(*(long **)(this + 8),painter);
  }
  else {
    pqVar6 = (qreal *)&DAT_006525c8;
    pQVar8 = &restoreTransform;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar10 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    pqVar6 = (qreal *)&DAT_006531e0;
    pQVar8 = &restoreTransform;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar10 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    restoreTransform._72_2_ = 0xa800;
    if (*(int *)(lVar2 + 0x78) == 0) {
      puVar4 = (undefined1 *)QPainter::worldTransform();
      pQVar8 = &restoreTransform;
      for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined1 *)pQVar8->m_matrix[0] = *puVar4;
        puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
        pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar10 * -2 + 1);
      }
      puVar7 = &DAT_006531e0;
      puVar9 = local_c8;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar9 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
      }
      local_80 = 0;
      QPainter::setWorldTransform((QTransform *)painter,SUB81(local_c8,0));
    }
    QPainter::drawPixmap(painter,(QPoint *)(lVar2 + 0x80),(QPixmap *)&local_e8);
    if (*(int *)(lVar2 + 0x78) == 0) {
      QPainter::setWorldTransform((QTransform *)painter,SUB81(&restoreTransform,0));
    }
  }
  QPixmap::~QPixmap((QPixmap *)&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsEffectSource::draw(QPainter *painter)
{
    Q_D(const QGraphicsEffectSource);

    QPixmap pm;
    if (QPixmapCache::find(d->m_cacheKey, &pm)) {
        QTransform restoreTransform;
        if (d->m_cachedSystem == Qt::DeviceCoordinates) {
            restoreTransform = painter->worldTransform();
            painter->setWorldTransform(QTransform());
        }

        painter->drawPixmap(d->m_cachedOffset, pm);

        if (d->m_cachedSystem == Qt::DeviceCoordinates)
            painter->setWorldTransform(restoreTransform);
    } else {
        d_func()->draw(painter);
    }
}